

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

int __thiscall
sqvector<SQClassMember>::copy(sqvector<SQClassMember> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  SQUnsignedInteger i;
  SQClassMember *in_stack_ffffffffffffffb0;
  SQClassMember *pSVar1;
  SQClassMember local_38;
  EVP_PKEY_CTX *local_10;
  sqvector<SQClassMember> *local_8;
  
  local_10 = dst;
  local_8 = this;
  if (this->_size != 0) {
    local_38.attrs.super_SQObject._type = 0;
    local_38.attrs.super_SQObject._4_4_ = 0;
    local_38.attrs.super_SQObject._unVal.pTable = (SQTable *)0x0;
    local_38.val.super_SQObject._type = 0;
    local_38.val.super_SQObject._4_4_ = 0;
    local_38.val.super_SQObject._unVal.pTable = (SQTable *)0x0;
    pSVar1 = &local_38;
    SQClassMember::SQClassMember(in_stack_ffffffffffffffb0);
    resize((sqvector<SQClassMember> *)in_stack_ffffffffffffffb0,(SQUnsignedInteger)this,pSVar1);
    SQClassMember::~SQClassMember(pSVar1);
  }
  if (*(ulong *)&(((SQClassMember *)this)->attrs).super_SQObject < *(ulong *)(local_10 + 8)) {
    _realloc((sqvector<SQClassMember> *)in_stack_ffffffffffffffb0,(SQUnsignedInteger)this);
  }
  for (pSVar1 = (SQClassMember *)0x0; pSVar1 < *(SQClassMember **)(local_10 + 8);
      pSVar1 = (SQClassMember *)((long)&(pSVar1->val).super_SQObject._type + 1)) {
    SQClassMember::SQClassMember(pSVar1,(SQClassMember *)this);
  }
  (((SQClassMember *)this)->val).super_SQObject._unVal = *(SQObjectValue *)(local_10 + 8);
  return (int)this;
}

Assistant:

void copy(const sqvector<T>& v)
    {
        if(_size) {
            resize(0); //destroys all previous stuff
        }
        //resize(v._size);
        if(v._size > _allocated) {
            _realloc(v._size);
        }
        for(SQUnsignedInteger i = 0; i < v._size; i++) {
            new ((void *)&_vals[i]) T(v._vals[i]);
        }
        _size = v._size;
    }